

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O0

void __thiscall spatial_region::fout_tracks(spatial_region *this,double a,int nm)

{
  cellp ***pppcVar1;
  char *pcVar2;
  ostream *poVar3;
  int in_ESI;
  int *in_RDI;
  double in_XMM0_Qa;
  ofstream fout;
  char file_num_pchar [20];
  string file_name;
  particle *current;
  int k;
  int j;
  int i;
  ostream *in_stack_fffffffffffffc28;
  field3d<cellp> *in_stack_fffffffffffffc30;
  ostream *in_stack_fffffffffffffc50;
  ostream *in_stack_fffffffffffffc58;
  ostream local_2f8 [512];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [48];
  string local_88 [32];
  char local_68 [32];
  string local_48 [32];
  particle *local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  double local_10;
  
  local_14 = in_ESI;
  local_10 = in_XMM0_Qa;
  for (local_18 = 0; local_18 < *in_RDI; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < in_RDI[1]; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < in_RDI[2]; local_20 = local_20 + 1) {
        pppcVar1 = field3d<cellp>::operator[]
                             (in_stack_fffffffffffffc30,
                              (int)((ulong)in_stack_fffffffffffffc28 >> 0x20));
        for (local_28 = (*pppcVar1)[local_1c][local_20].pl.head; local_28 != (particle *)0x0;
            local_28 = local_28->next) {
          if (local_28->trn != 0) {
            if ((double)local_14 <= local_28->x) {
              if (local_28->x < (double)(*in_RDI - local_14)) {
                std::__cxx11::string::string(local_48);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
                std::__cxx11::string::operator=(local_48,local_88);
                std::__cxx11::string::~string(local_88);
                sprintf(local_68,"%g",local_28->cmr);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
                std::__cxx11::string::operator=(local_48,local_b8);
                std::__cxx11::string::~string(local_b8);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
                std::__cxx11::string::operator=(local_48,local_d8);
                std::__cxx11::string::~string(local_d8);
                sprintf(local_68,"%d",(ulong)(uint)local_28->trn);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
                std::__cxx11::string::operator=(local_48,local_f8);
                std::__cxx11::string::~string(local_f8);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                std::ofstream::ofstream(local_2f8,pcVar2,_S_app);
                poVar3 = (ostream *)std::ostream::operator<<(local_2f8,local_28->q);
                poVar3 = std::operator<<(poVar3,'\n');
                poVar3 = (ostream *)
                         std::ostream::operator<<
                                   (poVar3,(local_28->x * *(double *)(in_RDI + 4) * 0.5) /
                                           3.141592653589793 + local_10);
                poVar3 = std::operator<<(poVar3,'\n');
                poVar3 = (ostream *)
                         std::ostream::operator<<
                                   (poVar3,(local_28->y * *(double *)(in_RDI + 6) * 0.5) /
                                           3.141592653589793);
                poVar3 = std::operator<<(poVar3,'\n');
                poVar3 = (ostream *)
                         std::ostream::operator<<
                                   (poVar3,(local_28->z * *(double *)(in_RDI + 8) * 0.5) /
                                           3.141592653589793);
                poVar3 = std::operator<<(poVar3,'\n');
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28->ux);
                poVar3 = std::operator<<(poVar3,'\n');
                in_stack_fffffffffffffc58 = (ostream *)std::ostream::operator<<(poVar3,local_28->uy)
                ;
                in_stack_fffffffffffffc50 = std::operator<<(in_stack_fffffffffffffc58,'\n');
                poVar3 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffc50,local_28->uz)
                ;
                poVar3 = std::operator<<(poVar3,'\n');
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28->g);
                in_stack_fffffffffffffc30 = (field3d<cellp> *)std::operator<<(poVar3,'\n');
                in_stack_fffffffffffffc28 =
                     (ostream *)
                     std::ostream::operator<<((ostream *)in_stack_fffffffffffffc30,local_28->chi);
                std::operator<<(in_stack_fffffffffffffc28,'\n');
                std::ofstream::~ofstream(local_2f8);
                std::__cxx11::string::~string(local_48);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void spatial_region::fout_tracks(double a, int nm) {
    for (int i=0;i<nx;i++) {
        for (int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++) {
                particle* current;
                current = cp[i][j][k].pl.head;
                while (current!=0) {
                    if (current->trn!=0 && current->x>=nm && current->x<nx-nm) {
                        std::string file_name;
                        char file_num_pchar[20];
                        file_name = spatial_region::data_folder+"/track_";
                        sprintf(file_num_pchar,"%g",current->cmr);
                        file_name = file_name + file_num_pchar;
                        file_name = file_name + "_";
                        sprintf(file_num_pchar,"%d",current->trn);
                        file_name = file_name + file_num_pchar;
                        ofstream fout(file_name.c_str(),ios::app);
                        #ifdef QUILL_NOQED
                        fout<<current->q<<'\n'<<current->x*dx/2/PI+a<<'\n'<<current->y*dy/2/PI<<'\n'<<current->z*dz/2/PI<<'\n'<<current->ux<<'\n'<<current->uy<<'\n'<<current->uz<<'\n'<<current->g<<'\n'<< 0.0 <<'\n';
                        #else
                        fout<<current->q<<'\n'<<current->x*dx/2/PI+a<<'\n'<<current->y*dy/2/PI<<'\n'<<current->z*dz/2/PI<<'\n'<<current->ux<<'\n'<<current->uy<<'\n'<<current->uz<<'\n'<<current->g<<'\n'<<current->chi<<'\n';
                        #endif
                    }
                    current = current->next;
                }
            }
        }
    }
}